

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::PskdTest_Pskdvalidation_TooShortPskdShouldBeRejected_Test::
~PskdTest_Pskdvalidation_TooShortPskdShouldBeRejected_Test
          (PskdTest_Pskdvalidation_TooShortPskdShouldBeRejected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PskdTest, Pskdvalidation_TooShortPskdShouldBeRejected)
{
    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    std::shared_ptr<CommissionerApp> commApp;
    EXPECT_EQ(CommissionerAppCreate(commApp, config), ErrorCode::kNone);

    constexpr uint64_t eui64 = 0x0011223344556677;

    EXPECT_EQ(commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, "00001"), ErrorCode::kInvalidArgs);
}